

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

bool google::protobuf::internal::ReflectionOps::IsInitialized(Message *message)

{
  uint uVar1;
  long lVar2;
  FieldDescriptor *this;
  pointer ppFVar3;
  bool bVar4;
  int iVar5;
  CppType CVar6;
  int iVar7;
  undefined4 extraout_var;
  Reflection *this_00;
  ulong uVar8;
  Descriptor *pDVar9;
  MapFieldBase *this_01;
  Message *pMVar10;
  pointer ppFVar11;
  int index;
  ulong uVar12;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  MapIterator iter;
  MapIterator end;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_d8;
  MapIterator local_c0;
  MapIterator local_78;
  
  iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[0x11])();
  this_00 = GetReflectionOrDie(message);
  uVar1 = *(uint *)(CONCAT44(extraout_var,iVar5) + 4);
  uVar12 = 0;
  uVar8 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar8 = uVar12;
  }
  for (; uVar8 * 0x48 - uVar12 != 0; uVar12 = uVar12 + 0x48) {
    lVar2 = *(long *)(CONCAT44(extraout_var,iVar5) + 0x28);
    if (((*(byte *)(lVar2 + 1 + uVar12) & 0x60) == 0x40) &&
       (bVar4 = Reflection::HasField(this_00,message,(FieldDescriptor *)(lVar2 + uVar12)), !bVar4))
    {
      return false;
    }
  }
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFieldsOmitStripped
            (this_00,message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&local_d8);
  ppFVar3 = local_d8._M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar11 = local_d8._M_impl.super__Vector_impl_data._M_start; ppFVar11 != ppFVar3;
      ppFVar11 = ppFVar11 + 1) {
    this = *ppFVar11;
    CVar6 = FieldDescriptor::cpp_type(this);
    if (CVar6 == CPPTYPE_MESSAGE) {
      bVar4 = FieldDescriptor::is_map(this);
      if (bVar4) {
        pDVar9 = FieldDescriptor::message_type(this);
        CVar6 = FieldDescriptor::cpp_type((FieldDescriptor *)(*(long *)(pDVar9 + 0x28) + 0x48));
        if (CVar6 == CPPTYPE_MESSAGE) {
          this_01 = Reflection::GetMapData(this_00,message,this);
          bVar4 = MapFieldBase::IsMapValid(this_01);
          if (!bVar4) goto LAB_003a9ded;
          MapIterator::MapIterator(&local_c0,message,this);
          MapIterator::MapIterator(&local_78,message,this);
          (*this_01->_vptr_MapFieldBase[7])(this_01,&local_c0);
          (*this_01->_vptr_MapFieldBase[8])(this_01,&local_78);
          while (iVar5 = (*(local_c0.map_)->_vptr_MapFieldBase[6])
                                   (local_c0.map_,&local_c0,&local_78), (char)iVar5 == '\0') {
            pMVar10 = MapValueConstRef::GetMessageValue(&local_c0.value_.super_MapValueConstRef);
            iVar5 = (*(pMVar10->super_MessageLite)._vptr_MessageLite[5])(pMVar10);
            if ((char)iVar5 == '\0') {
              MapIterator::~MapIterator(&local_78);
              MapIterator::~MapIterator(&local_c0);
              goto LAB_003a9e8d;
            }
            (*(local_c0.map_)->_vptr_MapFieldBase[0x14])(local_c0.map_,&local_c0);
          }
          MapIterator::~MapIterator(&local_78);
          MapIterator::~MapIterator(&local_c0);
        }
      }
      else {
LAB_003a9ded:
        if ((~(byte)this[1] & 0x60) == 0) {
          iVar5 = Reflection::FieldSize(this_00,message,this);
          index = 0;
          if (iVar5 < 1) {
            iVar5 = index;
          }
          while (iVar5 != index) {
            pMVar10 = Reflection::GetRepeatedMessage(this_00,message,this,index);
            iVar7 = (*(pMVar10->super_MessageLite)._vptr_MessageLite[5])(pMVar10);
            index = index + 1;
            if ((char)iVar7 == '\0') goto LAB_003a9e8d;
          }
        }
        else {
          pMVar10 = Reflection::GetMessage(this_00,message,this,(MessageFactory *)0x0);
          iVar5 = (*(pMVar10->super_MessageLite)._vptr_MessageLite[5])(pMVar10);
          if ((char)iVar5 == '\0') break;
        }
      }
    }
  }
LAB_003a9e8d:
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&local_d8);
  return ppFVar11 == ppFVar3;
}

Assistant:

bool ReflectionOps::IsInitialized(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = GetReflectionOrDie(message);

  // Check required fields of this message.
  {
    const int field_count = descriptor->field_count();
    for (int i = 0; i < field_count; i++) {
      if (descriptor->field(i)->is_required()) {
        if (!reflection->HasField(message, descriptor->field(i))) {
          return false;
        }
      }
    }
  }

  // Check that sub-messages are initialized.
  std::vector<const FieldDescriptor*> fields;
  // Should be safe to skip stripped fields because required fields are not
  // stripped.
  reflection->ListFieldsOmitStripped(message, &fields);
  for (const FieldDescriptor* field : fields) {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {

      if (field->is_map()) {
        const FieldDescriptor* value_field = field->message_type()->field(1);
        if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          const MapFieldBase* map_field =
              reflection->GetMapData(message, field);
          if (map_field->IsMapValid()) {
            MapIterator iter(const_cast<Message*>(&message), field);
            MapIterator end(const_cast<Message*>(&message), field);
            for (map_field->MapBegin(&iter), map_field->MapEnd(&end);
                 iter != end; ++iter) {
              if (!iter.GetValueRef().GetMessageValue().IsInitialized()) {
                return false;
              }
            }
            continue;
          }
        } else {
          continue;
        }
      }

      if (field->is_repeated()) {
        int size = reflection->FieldSize(message, field);

        for (int j = 0; j < size; j++) {
          if (!reflection->GetRepeatedMessage(message, field, j)
                   .IsInitialized()) {
            return false;
          }
        }
      } else {
        if (!reflection->GetMessage(message, field).IsInitialized()) {
          return false;
        }
      }
    }
  }

  return true;
}